

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabDisconnect(sqlite3 *db,Table *p)

{
  VTable *pVTab_00;
  long in_RSI;
  long in_RDI;
  VTable *pVTab;
  VTable **ppVTab;
  long *local_18;
  
  local_18 = (long *)(in_RSI + 0x50);
  while( true ) {
    if (*local_18 == 0) {
      return;
    }
    if (*(long *)*local_18 == in_RDI) break;
    local_18 = (long *)(*local_18 + 0x28);
  }
  pVTab_00 = (VTable *)*local_18;
  *local_18 = (long)pVTab_00->pNext;
  sqlite3VtabUnlock(pVTab_00);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabDisconnect(sqlite3 *db, Table *p){
  VTable **ppVTab;

  assert( IsVirtual(p) );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  assert( sqlite3_mutex_held(db->mutex) );

  for(ppVTab=&p->u.vtab.p; *ppVTab; ppVTab=&(*ppVTab)->pNext){
    if( (*ppVTab)->db==db  ){
      VTable *pVTab = *ppVTab;
      *ppVTab = pVTab->pNext;
      sqlite3VtabUnlock(pVTab);
      break;
    }
  }
}